

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_rectangle<unsigned_char>
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int x1,int y1,int z1,uchar *color,
          float opacity)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  bool bVar6;
  CImgArgumentException *this_00;
  char *pcVar7;
  char *pcVar8;
  int local_50;
  int c;
  float opacity_local;
  int y1_local;
  int x1_local;
  int z0_local;
  int y0_local;
  int x0_local;
  CImg<unsigned_char> *this_local;
  
  bVar6 = is_empty(this);
  if (!bVar6) {
    if (color == (uchar *)0x0) {
      this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
      uVar1 = this->_width;
      uVar2 = this->_height;
      uVar3 = this->_depth;
      uVar4 = this->_spectrum;
      puVar5 = this->_data;
      pcVar7 = "non-";
      if ((this->_is_shared & 1U) != 0) {
        pcVar7 = "";
      }
      pcVar8 = pixel_type();
      CImgArgumentException::CImgArgumentException
                (this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::draw_rectangle(): Specified color is (null)."
                 ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar7,pcVar8);
      __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                  CImgArgumentException::~CImgArgumentException);
    }
    for (local_50 = 0; local_50 < (int)this->_spectrum; local_50 = local_50 + 1) {
      draw_rectangle(this,x0,y0,z0,local_50,x1,y1,z1,local_50,color[local_50],opacity);
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_rectangle(const int x0, const int y0, const int z0,
                            const int x1, const int y1, const int z1,
                            const tc *const color, const float opacity=1) {
      if (is_empty()) return *this;
      if (!color)
        throw CImgArgumentException(_cimg_instance
                                    "draw_rectangle(): Specified color is (null).",
                                    cimg_instance);
      cimg_forC(*this,c) draw_rectangle(x0,y0,z0,c,x1,y1,z1,c,(T)color[c],opacity);
      return *this;
    }